

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

JsonArrayView __thiscall Corrade::Utility::JsonToken::asArray(JsonToken *this)

{
  bool bVar1;
  Type TVar2;
  ostream *output;
  Debug *pDVar3;
  char *value;
  Flags local_49;
  Error local_48;
  JsonToken *local_20;
  JsonToken *this_local;
  
  local_20 = this;
  TVar2 = type(this);
  if (TVar2 == Array) {
    bVar1 = isParsed(this);
    if (bVar1) {
      JsonView<Corrade::Utility::JsonArrayItem>::JsonView
                ((JsonView<Corrade::Utility::JsonArrayItem> *)&this_local,this + 1,
                 this + (this->field_2)._childCount + 1);
      return _this_local;
    }
  }
  output = Error::defaultOutput();
  Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_49);
  Error::Error(&local_48,output,local_49);
  pDVar3 = Debug::operator<<(&local_48.super_Debug,"Utility::JsonToken::asArray(): token is");
  bVar1 = isParsed(this);
  value = "an unparsed";
  if (bVar1) {
    value = "a parsed";
  }
  pDVar3 = Debug::operator<<(pDVar3,value);
  TVar2 = type(this);
  Utility::operator<<(pDVar3,TVar2);
  Error::~Error(&local_48);
  abort();
}

Assistant:

JsonArrayView JsonToken::asArray() const {
    CORRADE_ASSERT(type() == Type::Array && isParsed(),
        "Utility::JsonToken::asArray(): token is" << (isParsed() ? "a parsed" : "an unparsed") << type(),
        (JsonArrayView{this + 1, this + 1}));

    return JsonArrayView{this + 1, this + 1 +
        #ifndef CORRADE_TARGET_32BIT
        _childCount
        #else
        (_childCountFlagsTypeNan & ChildCountMask)
        #endif
        };
}